

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_cursor.hpp
# Opt level: O1

void __thiscall
jsoncons::cbor::basic_cbor_cursor<jsoncons::bytes_source,std::allocator<char>>::
basic_cbor_cursor<std::__cxx11::string_const&>
          (basic_cbor_cursor<jsoncons::bytes_source,std::allocator<char>> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *source,
          cbor_decode_options *options,allocator<char> *alloc)

{
  char cVar1;
  
  *(undefined8 *)this = 0xb5b8b8;
  *(undefined8 *)(this + 0x238) = 0xb5b958;
  basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>::
  basic_cbor_parser<std::__cxx11::string_const&>
            ((basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>> *)(this + 8),source,
             options,alloc);
  *(undefined ***)(this + 0x100) = &PTR__basic_json_visitor_00b59940;
  *(undefined2 *)(this + 0x108) = 3;
  *(undefined4 *)(this + 0x130) = 0;
  *(undefined8 *)(this + 0x110) = 0;
  *(undefined8 *)(this + 0x118) = 0;
  *(undefined8 *)(this + 0x11c) = 0;
  *(undefined8 *)(this + 0x124) = 0;
  *(undefined8 *)(this + 0x138) = 0;
  *(undefined8 *)(this + 0x140) = 0;
  *(undefined8 *)(this + 0x148) = 0;
  *(undefined8 *)(this + 0x150) = 0;
  *(undefined8 *)(this + 0x158) = 0;
  basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::
  basic_item_event_visitor_to_json_visitor
            ((basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_> *)(this + 0x160)
             ,(basic_json_visitor<char> *)(this + 0x100),alloc);
  this[0x230] = (basic_cbor_cursor<jsoncons::bytes_source,std::allocator<char>>)0x0;
  this[0x12] = (basic_cbor_cursor<jsoncons::bytes_source,std::allocator<char>>)0x1;
  cVar1 = (**(code **)(*(long *)this + 0x18))(this);
  if (cVar1 == '\0') {
    (**(code **)(*(long *)this + 0x38))(this);
  }
  return;
}

Assistant:

basic_cbor_cursor(Sourceable&& source,
        const cbor_decode_options& options = cbor_decode_options(),
        const Allocator& alloc = Allocator())
        : parser_(std::forward<Sourceable>(source), options, alloc), 
          cursor_handler_adaptor_(cursor_visitor_, alloc)
    {
        parser_.cursor_mode(true);
        if (!done())
        {
            next();
        }
    }